

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteAiger.c
# Opt level: O1

void Io_WriteAigerGz(Abc_Ntk_t *pNtk,char *pFileName,int fWriteSymbols)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined8 *puVar4;
  long *plVar5;
  long lVar6;
  long *plVar7;
  bool bVar8;
  uint uVar9;
  gzFile file;
  Abc_Obj_t *pAVar10;
  void *buf;
  ProgressBar *p;
  char *pcVar11;
  Vec_Ptr_t *pVVar12;
  uint uVar13;
  long lVar14;
  byte *pbVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  char *format;
  size_t __size;
  ulong uVar20;
  int local_48;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWriteAiger.c"
                  ,0x1bd,"void Io_WriteAigerGz(Abc_Ntk_t *, char *, int)");
  }
  file = gzopen(pFileName,"wb");
  if (file == (gzFile)0x0) {
    fprintf(_stdout,"Io_WriteAigerGz(): Cannot open the output file \"%s\".\n",pFileName);
    return;
  }
  iVar2 = pNtk->nConstrs;
  pAVar10 = Abc_AigConst1(pNtk);
  (pAVar10->field_6).pTemp = (void *)0x0;
  pVVar12 = pNtk->vCis;
  if (pVVar12->nSize < 1) {
    uVar20 = 1;
  }
  else {
    uVar18 = 1;
    do {
      *(ulong *)((long)pVVar12->pArray[uVar18 - 1] + 0x40) = uVar18;
      uVar20 = uVar18 + 1;
      pVVar12 = pNtk->vCis;
      bVar8 = (long)uVar18 < (long)pVVar12->nSize;
      uVar18 = uVar20;
    } while (bVar8);
  }
  pVVar12 = pNtk->vObjs;
  if (0 < pVVar12->nSize) {
    lVar14 = 0;
    do {
      puVar4 = (undefined8 *)pVVar12->pArray[lVar14];
      if (puVar4 != (undefined8 *)0x0) {
        if (((ulong)puVar4 & 1) != 0) goto LAB_002d7ed2;
        if (*(int *)*puVar4 != 3) goto LAB_002d7ec9;
        if (*(int *)((long)puVar4 + 0x1c) == 2) {
          uVar18 = uVar20 & 0xffffffff;
          uVar20 = (ulong)((int)uVar20 + 1);
          puVar4[8] = uVar18;
        }
      }
      lVar14 = lVar14 + 1;
      pVVar12 = pNtk->vObjs;
    } while (lVar14 < pVVar12->nSize);
  }
  uVar17 = pNtk->vPis->nSize;
  uVar13 = pNtk->nObjCounts[8];
  iVar3 = pNtk->nObjCounts[7];
  uVar20 = (ulong)(uVar13 + iVar3 + uVar17);
  if (iVar2 == 0) {
    gzprintf(file,"aig %u %u %u %u %u",uVar20,(ulong)uVar17,(ulong)uVar13,
             (ulong)(uint)pNtk->vPos->nSize,iVar3);
  }
  else {
    gzprintf(file,"aig %u %u %u %u %u",uVar20,(ulong)uVar17,(ulong)uVar13,0,iVar3);
    gzprintf(file," %u %u",(ulong)(uint)(pNtk->vPos->nSize - pNtk->nConstrs));
  }
  gzprintf(file,"\n");
  Abc_NtkInvertConstraints(pNtk);
  pVVar12 = pNtk->vBoxes;
  if (0 < pVVar12->nSize) {
    lVar14 = 0;
    do {
      plVar5 = (long *)pVVar12->pArray[lVar14];
      if ((*(uint *)((long)plVar5 + 0x14) & 0xf) == 8) {
        lVar6 = *(long *)(*(long *)(*plVar5 + 0x20) + 8);
        plVar7 = *(long **)(lVar6 + (long)*(int *)plVar5[4] * 8);
        iVar3 = *(int *)(*(long *)(*(long *)(*(long *)(*plVar7 + 0x20) + 8) +
                                  (long)*(int *)plVar7[4] * 8) + 0x40);
        if (3 < (ulong)plVar5[7]) {
          __assert_fail("Abc_LatchIsInitNone(pLatch) || Abc_LatchIsInitDc(pLatch)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWriteAiger.c"
                        ,0x1ee,"void Io_WriteAigerGz(Abc_Ntk_t *, char *, int)");
        }
        uVar20 = (ulong)(((uint)(iVar3 == 0) ^ *(uint *)((long)plVar7 + 0x14) >> 10 & 1) + iVar3 * 2
                        );
        switch(plVar5[7]) {
        default:
          gzprintf(file,"%u %u\n",uVar20,
                   (ulong)(uint)(*(int *)(*(long *)(lVar6 + (long)*(int *)plVar5[6] * 8) + 0x40) * 2
                                ));
          goto LAB_002d7aa9;
        case 1:
          pcVar11 = "%u\n";
          break;
        case 2:
          pcVar11 = "%u 1\n";
        }
        gzprintf(file,pcVar11,uVar20);
      }
LAB_002d7aa9:
      lVar14 = lVar14 + 1;
      pVVar12 = pNtk->vBoxes;
    } while (lVar14 < pVVar12->nSize);
  }
  pVVar12 = pNtk->vPos;
  if (0 < pVVar12->nSize) {
    lVar14 = 0;
    do {
      plVar5 = (long *)pVVar12->pArray[lVar14];
      iVar3 = *(int *)(*(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                (long)*(int *)plVar5[4] * 8) + 0x40);
      gzprintf(file,"%u\n",
               (ulong)(((uint)(iVar3 == 0) ^ *(uint *)((long)plVar5 + 0x14) >> 10 & 1) + iVar3 * 2))
      ;
      lVar14 = lVar14 + 1;
      pVVar12 = pNtk->vPos;
    } while (lVar14 < pVVar12->nSize);
  }
  Abc_NtkInvertConstraints(pNtk);
  iVar3 = pNtk->nObjCounts[7];
  __size = (long)iVar3 * 6 + 100;
  buf = malloc(__size);
  p = Extra_ProgressBarStart((FILE *)_stdout,pNtk->vObjs->nSize);
  pVVar12 = pNtk->vObjs;
  if (pVVar12->nSize < 1) {
    uVar17 = 0;
  }
  else {
    lVar14 = 0;
    uVar17 = 0;
    do {
      plVar5 = (long *)pVVar12->pArray[lVar14];
      if (plVar5 != (long *)0x0) {
        if (((ulong)plVar5 & 1) != 0) goto LAB_002d7ed2;
        if (*(int *)*plVar5 != 3) goto LAB_002d7ec9;
        if (*(int *)((long)plVar5 + 0x1c) == 2) {
          if ((p == (ProgressBar *)0x0) || (p->nItemsNext <= lVar14)) {
            Extra_ProgressBarUpdate_int(p,(int)lVar14,(char *)0x0);
          }
          uVar19 = (int)plVar5[8] * 2;
          lVar6 = *(long *)(*(long *)(*plVar5 + 0x20) + 8);
          uVar13 = (*(uint *)((long)plVar5 + 0x14) >> 10 & 1) +
                   *(int *)(*(long *)(lVar6 + (long)*(int *)plVar5[4] * 8) + 0x40) * 2;
          uVar9 = (*(uint *)((long)plVar5 + 0x14) >> 0xb & 1) +
                  *(int *)(*(long *)(lVar6 + (long)((int *)plVar5[4])[1] * 8) + 0x40) * 2;
          uVar1 = uVar9;
          if (uVar13 < uVar9) {
            uVar1 = uVar13;
          }
          if (uVar9 < uVar13) {
            uVar9 = uVar13;
          }
          uVar13 = uVar19 - uVar9;
          if (uVar19 < uVar9 || uVar13 == 0) {
            __assert_fail("uLit1 < uLit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWriteAiger.c"
                          ,0x20b,"void Io_WriteAigerGz(Abc_Ntk_t *, char *, int)");
          }
          if (0x7f < uVar13) {
            pbVar15 = (byte *)((long)(int)uVar17 + (long)buf);
            uVar19 = uVar13;
            do {
              *pbVar15 = (byte)uVar19 | 0x80;
              uVar13 = uVar19 >> 7;
              pbVar15 = pbVar15 + 1;
              uVar17 = uVar17 + 1;
              bVar8 = 0x3fff < uVar19;
              uVar19 = uVar13;
            } while (bVar8);
          }
          iVar16 = uVar17 + 1;
          *(char *)((long)buf + (long)(int)uVar17) = (char)uVar13;
          uVar9 = uVar9 - uVar1;
          if (0x7f < uVar9) {
            pbVar15 = (byte *)((long)iVar16 + (long)buf);
            uVar17 = uVar9;
            do {
              *pbVar15 = (byte)uVar17 | 0x80;
              uVar9 = uVar17 >> 7;
              pbVar15 = pbVar15 + 1;
              iVar16 = iVar16 + 1;
              bVar8 = 0x3fff < uVar17;
              uVar17 = uVar9;
            } while (bVar8);
          }
          *(char *)((long)buf + (long)iVar16) = (char)uVar9;
          if (iVar3 * 6 + 0x5a <= iVar16) {
            puts(
                "Io_WriteAiger(): AIGER generation has failed because the allocated buffer is too small."
                );
            goto LAB_002d7ea5;
          }
          uVar17 = iVar16 + 1;
        }
      }
      lVar14 = lVar14 + 1;
      pVVar12 = pNtk->vObjs;
    } while (lVar14 < pVVar12->nSize);
  }
  local_48 = (int)__size;
  if (local_48 <= (int)uVar17) {
    __assert_fail("Pos < nBufferSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWriteAiger.c"
                  ,0x215,"void Io_WriteAigerGz(Abc_Ntk_t *, char *, int)");
  }
  Extra_ProgressBarStop(p);
  gzwrite(file,buf,uVar17);
  if (buf != (void *)0x0) {
    free(buf);
  }
  if (fWriteSymbols != 0) {
    pVVar12 = pNtk->vPis;
    if (0 < pVVar12->nSize) {
      uVar20 = 0;
      do {
        pcVar11 = Abc_ObjName((Abc_Obj_t *)pVVar12->pArray[uVar20]);
        gzprintf(file,"i%d %s\n",uVar20 & 0xffffffff,pcVar11);
        uVar20 = uVar20 + 1;
        pVVar12 = pNtk->vPis;
      } while ((long)uVar20 < (long)pVVar12->nSize);
    }
    pVVar12 = pNtk->vBoxes;
    if (0 < pVVar12->nSize) {
      uVar20 = 0;
      do {
        plVar5 = (long *)pVVar12->pArray[uVar20];
        if ((*(uint *)((long)plVar5 + 0x14) & 0xf) == 8) {
          pcVar11 = Abc_ObjName(*(Abc_Obj_t **)
                                 (*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                 (long)*(int *)plVar5[6] * 8));
          gzprintf(file,"l%d %s\n",uVar20 & 0xffffffff,pcVar11);
        }
        uVar20 = uVar20 + 1;
        pVVar12 = pNtk->vBoxes;
      } while ((long)uVar20 < (long)pVVar12->nSize);
    }
    pVVar12 = pNtk->vPos;
    uVar20 = (ulong)(uint)pVVar12->nSize;
    if (0 < pVVar12->nSize) {
      uVar18 = 0;
      do {
        pAVar10 = (Abc_Obj_t *)pVVar12->pArray[uVar18];
        if (iVar2 == 0) {
          pcVar11 = Abc_ObjName(pAVar10);
          format = "o%d %s\n";
LAB_002d7e10:
          uVar20 = uVar18 & 0xffffffff;
        }
        else {
          iVar3 = pNtk->nConstrs;
          if ((long)uVar18 < (long)((int)uVar20 - iVar3)) {
            pcVar11 = Abc_ObjName(pAVar10);
            format = "b%d %s\n";
            goto LAB_002d7e10;
          }
          pcVar11 = Abc_ObjName(pAVar10);
          format = "c%d %s\n";
          uVar20 = (ulong)(uint)((iVar3 - (int)uVar20) + (int)uVar18);
        }
        gzprintf(file,format,uVar20,pcVar11);
        uVar18 = uVar18 + 1;
        pVVar12 = pNtk->vPos;
        uVar20 = (ulong)pVVar12->nSize;
      } while ((long)uVar18 < (long)uVar20);
    }
  }
  gzprintf(file,"c\n");
  if ((pNtk->pName != (char *)0x0) && (*pNtk->pName != '\0')) {
    gzprintf(file,".model %s\n");
  }
  pcVar11 = Extra_TimeStamp();
  gzprintf(file,"This file was produced by ABC on %s\n",pcVar11);
  gzprintf(file,"For information about AIGER format, refer to %s\n","http://fmv.jku.at/aiger");
LAB_002d7ea5:
  gzclose(file);
  return;
LAB_002d7ed2:
  pcVar11 = "!Abc_ObjIsComplement(pNode)";
  goto LAB_002d7ed9;
LAB_002d7ec9:
  pcVar11 = "Abc_NtkIsStrash(pNode->pNtk)";
LAB_002d7ed9:
  __assert_fail(pcVar11,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                ,0x18e,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
}

Assistant:

void Io_WriteAigerGz( Abc_Ntk_t * pNtk, char * pFileName, int fWriteSymbols )
{
    ProgressBar * pProgress;
    gzFile pFile;
    Abc_Obj_t * pObj, * pDriver, * pLatch;
    int i, nNodes, Pos, nBufferSize, fExtended;
    unsigned char * pBuffer;
    unsigned uLit0, uLit1, uLit;

    assert( Abc_NtkIsStrash(pNtk) );
    // start the output stream
    pFile = gzopen( pFileName, "wb" ); // if pFileName doesn't end in ".gz" then this acts as a passthrough to fopen
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteAigerGz(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }

    fExtended = Abc_NtkConstrNum(pNtk);

    // set the node numbers to be used in the output file
    nNodes = 0;
    Io_ObjSetAigerNum( Abc_AigConst1(pNtk), nNodes++ );
    Abc_NtkForEachCi( pNtk, pObj, i )
        Io_ObjSetAigerNum( pObj, nNodes++ );
    Abc_AigForEachAnd( pNtk, pObj, i )
        Io_ObjSetAigerNum( pObj, nNodes++ );

    // write the header "M I L O A" where M = I + L + A
    gzprintf( pFile, "aig %u %u %u %u %u", 
              Abc_NtkPiNum(pNtk) + Abc_NtkLatchNum(pNtk) + Abc_NtkNodeNum(pNtk), 
              Abc_NtkPiNum(pNtk),
              Abc_NtkLatchNum(pNtk),
              fExtended ? 0 : Abc_NtkPoNum(pNtk),
              Abc_NtkNodeNum(pNtk) );
    // write the extended header "B C J F"
    if ( fExtended )
        gzprintf( pFile, " %u %u", Abc_NtkPoNum(pNtk) - Abc_NtkConstrNum(pNtk), Abc_NtkConstrNum(pNtk) );
    gzprintf( pFile, "\n" ); 

    // if the driver node is a constant, we need to complement the literal below
    // because, in the AIGER format, literal 0/1 is represented as number 0/1
    // while, in ABC, constant 1 node has number 0 and so literal 0/1 will be 1/0

    // write latch drivers
    Abc_NtkInvertConstraints( pNtk );
    Abc_NtkForEachLatch( pNtk, pLatch, i )
    {
        pObj = Abc_ObjFanin0(pLatch);
        pDriver = Abc_ObjFanin0(pObj);
        uLit = Io_ObjMakeLit( Io_ObjAigerNum(pDriver), Abc_ObjFaninC0(pObj) ^ (Io_ObjAigerNum(pDriver) == 0) );
        if ( Abc_LatchIsInit0(pLatch) )
            gzprintf( pFile, "%u\n", uLit );
        else if ( Abc_LatchIsInit1(pLatch) )
            gzprintf( pFile, "%u 1\n", uLit );
        else
        {
            // Both None and DC are written as 'uninitialized' e.g. a free boolean value
            assert( Abc_LatchIsInitNone(pLatch) || Abc_LatchIsInitDc(pLatch) );
            gzprintf( pFile, "%u %u\n", uLit, Io_ObjMakeLit( Io_ObjAigerNum(Abc_ObjFanout0(pLatch)), 0 ) );
        }
    }
    // write PO drivers
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        pDriver = Abc_ObjFanin0(pObj);
        gzprintf( pFile, "%u\n", Io_ObjMakeLit( Io_ObjAigerNum(pDriver), Abc_ObjFaninC0(pObj) ^ (Io_ObjAigerNum(pDriver) == 0) ) );
    }
    Abc_NtkInvertConstraints( pNtk );

    // write the nodes into the buffer
    Pos = 0;
    nBufferSize = 6 * Abc_NtkNodeNum(pNtk) + 100; // skeptically assuming 3 chars per one AIG edge
    pBuffer = ABC_ALLOC( unsigned char, nBufferSize );
    pProgress = Extra_ProgressBarStart( stdout, Abc_NtkObjNumMax(pNtk) );
    Abc_AigForEachAnd( pNtk, pObj, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        uLit  = Io_ObjMakeLit( Io_ObjAigerNum(pObj), 0 );
        uLit0 = Io_ObjMakeLit( Io_ObjAigerNum(Abc_ObjFanin0(pObj)), Abc_ObjFaninC0(pObj) );
        uLit1 = Io_ObjMakeLit( Io_ObjAigerNum(Abc_ObjFanin1(pObj)), Abc_ObjFaninC1(pObj) );
        if ( uLit0 > uLit1 )
        {
            unsigned Temp = uLit0;
            uLit0 = uLit1;
            uLit1 = Temp;
        }
        assert( uLit1 < uLit );
        Pos = Io_WriteAigerEncode( pBuffer, Pos, uLit  - uLit1 );
        Pos = Io_WriteAigerEncode( pBuffer, Pos, uLit1 - uLit0 );
        if ( Pos > nBufferSize - 10 )
        {
            printf( "Io_WriteAiger(): AIGER generation has failed because the allocated buffer is too small.\n" );
	        gzclose( pFile );
            return;
        }
    }
    assert( Pos < nBufferSize );
    Extra_ProgressBarStop( pProgress );

    // write the buffer
    gzwrite(pFile, pBuffer, Pos);
    ABC_FREE( pBuffer );

    // write the symbol table
    if ( fWriteSymbols )
    {
        // write PIs
        Abc_NtkForEachPi( pNtk, pObj, i )
            gzprintf( pFile, "i%d %s\n", i, Abc_ObjName(pObj) );
        // write latches
        Abc_NtkForEachLatch( pNtk, pObj, i )
            gzprintf( pFile, "l%d %s\n", i, Abc_ObjName(Abc_ObjFanout0(pObj)) );
        // write POs
        Abc_NtkForEachPo( pNtk, pObj, i )
            if ( !fExtended )
                gzprintf( pFile, "o%d %s\n", i, Abc_ObjName(pObj) );
            else if ( i < Abc_NtkPoNum(pNtk) - Abc_NtkConstrNum(pNtk) )
                gzprintf( pFile, "b%d %s\n", i, Abc_ObjName(pObj) );
            else
                gzprintf( pFile, "c%d %s\n", i - (Abc_NtkPoNum(pNtk) - Abc_NtkConstrNum(pNtk)), Abc_ObjName(pObj) );
    }

    // write the comment
    gzprintf( pFile, "c\n" );
    if ( pNtk->pName && strlen(pNtk->pName) > 0 )
        gzprintf( pFile, ".model %s\n", pNtk->pName );
    gzprintf( pFile, "This file was produced by ABC on %s\n", Extra_TimeStamp() );
    gzprintf( pFile, "For information about AIGER format, refer to %s\n", "http://fmv.jku.at/aiger" );
	gzclose( pFile );
}